

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

Wlc_Prs_t * Wlc_PrsStart(char *pFileName)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Mem_Flex_t *pMVar6;
  Wlc_Prs_t *p;
  char *pFileName_local;
  
  iVar1 = Extra_FileCheck(pFileName);
  if (iVar1 == 0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)calloc(1,0x448);
    *(char **)((long)pFileName_local + 8) = pFileName;
    pcVar2 = Extra_FileReadContents(pFileName);
    *(char **)((long)pFileName_local + 0x10) = pcVar2;
    sVar3 = strlen(*(char **)((long)pFileName_local + 0x10));
    *(int *)pFileName_local = (int)sVar3;
    if (*(int *)pFileName_local < 1) {
      __assert_fail("p->nFileSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                    ,0x57,"Wlc_Prs_t *Wlc_PrsStart(char *)");
    }
    pVVar4 = Vec_IntAlloc(*(int *)pFileName_local / 0x32);
    *(Vec_Int_t **)((long)pFileName_local + 0x18) = pVVar4;
    pVVar4 = Vec_IntAlloc(*(int *)pFileName_local / 0x32);
    *(Vec_Int_t **)((long)pFileName_local + 0x20) = pVVar4;
    pVVar4 = Vec_IntAlloc(100);
    *(Vec_Int_t **)((long)pFileName_local + 0x28) = pVVar4;
    pVVar5 = Vec_PtrAlloc(1000);
    *(Vec_Ptr_t **)((long)pFileName_local + 0x40) = pVVar5;
    pMVar6 = Mem_FlexStart();
    *(Mem_Flex_t **)((long)pFileName_local + 0x38) = pMVar6;
  }
  return (Wlc_Prs_t *)pFileName_local;
}

Assistant:

Wlc_Prs_t * Wlc_PrsStart( char * pFileName )
{
    Wlc_Prs_t * p;
    if ( !Extra_FileCheck( pFileName ) )
        return NULL;
    p = ABC_CALLOC( Wlc_Prs_t, 1 );
    p->pFileName = pFileName;
    p->pBuffer   = Extra_FileReadContents( pFileName );
    p->nFileSize = strlen(p->pBuffer);  assert( p->nFileSize > 0 );
    p->vLines    = Vec_IntAlloc( p->nFileSize / 50 );
    p->vStarts   = Vec_IntAlloc( p->nFileSize / 50 );
    p->vFanins   = Vec_IntAlloc( 100 );
    p->vTables   = Vec_PtrAlloc( 1000 );
    p->pMemTable = Mem_FlexStart();
    return p;
}